

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O2

iterator_range<burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
* __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *args,int *args_1)

{
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  end;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  begin;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  local_e8;
  int *local_b8;
  int *piStack_b0;
  difference_type local_a8;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  buffer_value_type *local_90;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  local_88;
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  local_58;
  
  make_buffered_chunk_iterator<boost::iterator_range<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,int>
            (&local_58,(burst *)args,
             (iterator_range<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)(ulong)(uint)*args_1,(int)args_1);
  buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
  ::buffered_chunk_iterator(&local_88,&local_58);
  local_a8 = local_58.m_chunk_size;
  local_b8 = local_58.m_current._M_current;
  piStack_b0 = local_58.m_end._M_current;
  local_a0 = local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Stack_98._M_pi =
       local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90 = local_58.m_chunk_end;
  local_e8.m_current._M_current = local_88.m_current._M_current;
  local_e8.m_end._M_current = local_88.m_end._M_current;
  local_e8.m_chunk_size = local_88.m_chunk_size;
  local_e8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_88.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_e8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_88.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_88.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_88.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.m_chunk_end = local_88.m_chunk_end;
  boost::
  make_iterator_range<burst::buffered_chunk_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>>
            (__return_storage_ptr__,(boost *)&local_b8,&local_e8,
             (buffered_chunk_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>
              *)args_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }